

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O3

void xPredIntraAngAdi_X_8(pel *pSrc,pel *dst,int i_dst,int uiDirMode,int iWidth,int iHeight)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  pel first_line [192];
  undefined4 local_fc;
  undefined1 auStack_f8 [200];
  
  uVar7 = iHeight / 2;
  uVar8 = (uVar7 + iWidth) - 1;
  uVar10 = iWidth * 2 + 1;
  uVar6 = uVar10;
  if ((int)uVar8 < (int)uVar10) {
    uVar6 = uVar8;
  }
  lVar12 = (long)(int)(uVar7 + iWidth + 0xe & 0xfffffff0);
  if ((int)uVar6 < 1) {
    uVar9 = 0;
  }
  else {
    uVar13 = 0;
    uVar14 = (uint)*pSrc;
    do {
      bVar1 = pSrc[uVar13 + 1];
      bVar2 = pSrc[uVar13 + 2];
      bVar3 = pSrc[uVar13 + 3];
      auStack_f8[uVar13] = (char)(((uint)bVar1 + (uint)bVar2) * 3 + uVar14 + bVar3 + 4 >> 3);
      auStack_f8[uVar13 + lVar12] = (char)((uint)bVar3 + (uint)bVar1 + (uint)bVar2 * 2 + 2 >> 2);
      uVar13 = uVar13 + 1;
      uVar14 = (uint)bVar1;
      uVar9 = uVar6;
      local_fc = uVar10;
    } while (uVar6 != uVar13);
  }
  if ((int)uVar10 < (int)uVar8) {
    lVar11 = (long)(int)uVar6;
    uVar4 = auStack_f8[lVar11 + lVar12 + -2];
    auStack_f8[lVar11 + lVar12 + -1] = uVar4;
    if ((int)uVar9 < (int)uVar8) {
      uVar5 = auStack_f8[lVar11 + -1];
      uVar13 = (ulong)uVar9;
      do {
        auStack_f8[uVar13] = uVar5;
        auStack_f8[uVar13 + lVar12] = uVar4;
        uVar13 = uVar13 + 1;
      } while (uVar8 != uVar13);
    }
  }
  if (1 < iHeight) {
    uVar13 = 0;
    do {
      memcpy(dst,auStack_f8 + uVar13,(long)iWidth);
      memcpy(dst + i_dst,auStack_f8 + uVar13 + lVar12,(long)iWidth);
      dst = dst + i_dst * 2;
      uVar13 = uVar13 + 1;
    } while (uVar7 != uVar13);
  }
  return;
}

Assistant:

static void xPredIntraAngAdi_X_8(pel *pSrc, pel *dst, int i_dst, int uiDirMode, int iWidth, int iHeight)
{
    ALIGNED_16(pel first_line[2 * (64 + 32)]);
    int line_size = iWidth + iHeight / 2 - 1;
    int real_size = min(line_size, iWidth * 2 + 1);
    int i;
    int aligned_line_size = ((line_size + 15) >> 4) << 4;
    pel *pfirst[2] = { first_line, first_line + aligned_line_size };

    for (i = 0; i < real_size; i++, pSrc++) {
        pfirst[0][i] = (pSrc[0] + (pSrc[1] + pSrc[2]) * 3 + pSrc[3] + 4) >> 3;
        pfirst[1][i] = (pSrc[1] + pSrc[2] * 2 + pSrc[3] + 2) >> 2;
    }

    // padding
    if (real_size < line_size) {
        int pad1, pad2;

        pfirst[1][real_size - 1] = pfirst[1][real_size - 2];

        pad1 = pfirst[0][real_size - 1];
        pad2 = pfirst[1][real_size - 1];
        for (; i < line_size; i++) {
            pfirst[0][i] = pad1;
            pfirst[1][i] = pad2;
        }
    }

    iHeight /= 2;

    for (i = 0; i < iHeight; i++) {
        memcpy(dst, pfirst[0] + i, iWidth * sizeof(pel));
        memcpy(dst + i_dst, pfirst[1] + i, iWidth * sizeof(pel));
        dst += i_dst * 2;
    }
}